

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool rw::writeChunkHeader(Stream *s,int32 type,int32 size)

{
  anon_struct_12_3_2a00130e buf;
  
  buf.type = type;
  buf.size = size;
  buf.id = libraryIDPack(version,build);
  (*s->_vptr_Stream[3])(s,&buf,0xc);
  return true;
}

Assistant:

bool
writeChunkHeader(Stream *s, int32 type, int32 size)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf = { type, size, libraryIDPack(version, build) };
	s->write32(&buf, 12);
	return true;
}